

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

dtime_tz_t
duckdb::DatePart::TimezoneOperator::
Operation<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t>
          (interval_t interval,dtime_tz_t timetz)

{
  uint in_EAX;
  dtime_t dVar1;
  long lVar2;
  date_t *in_R8;
  interval_t right;
  date_t date;
  undefined8 uStack_18;
  
  lVar2 = interval.micros;
  uStack_18._0_4_ = in_EAX;
  dVar1 = Time::NormalizeTimeTZ(timetz);
  uStack_18 = (ulong)(uint)uStack_18;
  right.micros = (long)&uStack_18 + 4;
  right.months = (int)lVar2;
  right.days = (int)((ulong)lVar2 >> 0x20);
  dVar1 = Interval::Add(dVar1.micros,interval._0_8_,right,in_R8);
  return (dtime_tz_t)
         ((long)(((int)(SUB168(SEXT816(lVar2) * SEXT816(-0x431bde82d7b634db),8) >> 0x12) -
                 (SUB164(SEXT816(lVar2) * SEXT816(-0x431bde82d7b634db),0xc) >> 0x1f)) + 0xe0ff) |
         dVar1.micros << 0x18);
}

Assistant:

static TR Operation(TA interval, TB timetz) {
			auto time = Time::NormalizeTimeTZ(timetz);
			date_t date(0);
			time = Interval::Add(time, interval, date);
			auto offset = UnsafeNumericCast<int32_t>(interval.micros / Interval::MICROS_PER_SEC);
			return TR(time, offset);
		}